

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  string *psVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  __shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ostream *poVar7;
  logic_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *entry;
  _Alloc_hider _Var8;
  shared_ptr<Node> condition;
  string event;
  _Any_data local_2a8;
  code *local_298;
  code *pcStack_290;
  _Any_data local_288;
  code *local_278;
  code *pcStack_270;
  string command;
  anon_class_16_1_e241f3bb predicate;
  string line;
  Database db;
  istringstream is;
  
  TestAll();
  db.storage._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &db.storage._M_t._M_impl.super__Rb_tree_header._M_header;
  db.storage._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  db.storage._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  db.storage._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  db.presence._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &db.presence._M_t._M_impl.super__Rb_tree_header._M_header;
  db.presence._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  db.presence._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  db.presence._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  db.storage._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       db.storage._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  db.presence._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       db.presence._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&line);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::string::~string((string *)&line);
      Database::~Database(&db);
      return 0;
    }
    std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&line,_S_in);
    command._M_dataplus._M_p = (pointer)&command.field_2;
    command._M_string_length = 0;
    command.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&is,(string *)&command);
    bVar3 = std::operator==(&command,"Add");
    if (bVar3) {
      condition.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._0_12_ =
           ParseDate((istream *)&is);
      ParseEvent_abi_cxx11_(&event,(istream *)&is);
      Database::Add(&db,(Date *)&condition,&event);
LAB_0010d7d5:
      std::__cxx11::string::~string((string *)&event);
    }
    else {
      bVar3 = std::operator==(&command,"Print");
      if (bVar3) {
        Database::Print(&db,(ostream *)&std::cout);
      }
      else {
        bVar3 = std::operator==(&command,"Del");
        if (bVar3) {
          ParseCondition((istream *)&event);
          std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&condition.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)&event);
          local_278 = (code *)0x0;
          pcStack_270 = (code *)0x0;
          local_288._M_unused._M_object = (void *)0x0;
          local_288._8_8_ = 0;
          p_Var6 = (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)operator_new(0x10);
          std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (p_Var6,&condition.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>);
          pcStack_270 = std::
                        _Function_handler<bool_(const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/rsaddatimov[P]database-cpp-project/main.cpp:42:30)>
                        ::_M_invoke;
          local_278 = std::
                      _Function_handler<bool_(const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/rsaddatimov[P]database-cpp-project/main.cpp:42:30)>
                      ::_M_manager;
          local_288._M_unused._M_object = p_Var6;
          iVar4 = Database::RemoveIf(&db,(Predicate *)&local_288);
          std::_Function_base::~_Function_base((_Function_base *)&local_288);
          poVar7 = std::operator<<((ostream *)&std::cout,"Removed ");
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar4);
          poVar7 = std::operator<<(poVar7," entries");
          std::endl<char,std::char_traits<char>>(poVar7);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&condition.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          psVar1 = &event;
        }
        else {
          bVar3 = std::operator==(&command,"Find");
          if (!bVar3) {
            bVar3 = std::operator==(&command,"Last");
            if (bVar3) {
              condition.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._0_12_ =
                   ParseDate((istream *)&is);
              Database::Last_abi_cxx11_(&event,&db,(Date *)&condition);
              poVar7 = std::operator<<((ostream *)&std::cout,(string *)&event);
              std::endl<char,std::char_traits<char>>(poVar7);
              goto LAB_0010d7d5;
            }
            if (command._M_string_length != 0) {
              this = (logic_error *)__cxa_allocate_exception(0x10);
              std::operator+(&event,"Unknown command: ",&command);
              std::logic_error::logic_error(this,(string *)&event);
              __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            goto LAB_0010da6b;
          }
          ParseCondition((istream *)&condition);
          std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)&predicate,
                     &condition.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>);
          local_2a8._M_unused._M_object = (void *)0x0;
          local_2a8._8_8_ = 0;
          local_298 = (code *)0x0;
          pcStack_290 = (code *)0x0;
          p_Var6 = (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)operator_new(0x10);
          std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (p_Var6,(__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)&predicate);
          pcStack_290 = std::
                        _Function_handler<bool_(const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/rsaddatimov[P]database-cpp-project/main.cpp:52:30)>
                        ::_M_invoke;
          local_298 = std::
                      _Function_handler<bool_(const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/rsaddatimov[P]database-cpp-project/main.cpp:52:30)>
                      ::_M_manager;
          local_2a8._M_unused._M_object = p_Var6;
          Database::FindIf((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&event,&db,(Predicate *)&local_2a8);
          std::_Function_base::~_Function_base((_Function_base *)&local_2a8);
          sVar2 = event._M_string_length;
          for (_Var8 = event._M_dataplus; _Var8._M_p != (pointer)sVar2;
              _Var8._M_p = _Var8._M_p + 0x20) {
            poVar7 = std::operator<<((ostream *)&std::cout,(string *)_Var8._M_p);
            std::endl<char,std::char_traits<char>>(poVar7);
          }
          poVar7 = std::operator<<((ostream *)&std::cout,"Found ");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7," entries");
          std::endl<char,std::char_traits<char>>(poVar7);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&event);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&predicate.condition.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          psVar1 = (string *)&condition;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar1->_M_string_length);
      }
    }
LAB_0010da6b:
    std::__cxx11::string::~string((string *)&command);
    std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  } while( true );
}

Assistant:

int main() {
    TestAll();

    Database db;

    for (string line; getline(cin, line); ) {
        istringstream is(line);

        string command;
        is >> command;

        if (command == "Add") {
            const auto date = ParseDate(is);
            const auto event = ParseEvent(is);

            db.Add(date, event);
        } else if (command == "Print") {
            db.Print(cout);
        } else if (command == "Del") {
            auto condition = ParseCondition(is);

            auto predicate = [condition](const Date& date, const string& event) {
                return condition->Evaluate(date, event);
            };

            int count = db.RemoveIf(predicate);

            cout << "Removed " << count << " entries" << endl;
        } else if (command == "Find") {
            auto condition = ParseCondition(is);

            auto predicate = [condition](const Date& date, const string& event) {
                return condition->Evaluate(date, event);
            };

            const auto entries = db.FindIf(predicate);

            for (const auto& entry : entries) {
                cout << entry << endl;
            }
            
            cout << "Found " << entries.size() << " entries" << endl;
        } else if (command == "Last") {
            try {
                cout << db.Last(ParseDate(is)) << endl;
            } catch (invalid_argument&) {
                cout << "No entries" << endl;
            }
        } else if (command.empty()) {
            continue;
        } else {
            throw logic_error("Unknown command: " + command);
        }
    }

    return 0;
}